

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

StkId luaF_close(lua_State *L,StkId level,int status,int yy)

{
  StkId o;
  StkId func;
  StkId pSVar1;
  TValue *pTVar2;
  long lVar3;
  TValue *io2_1;
  StkId tbc;
  
  lVar3 = (long)level - (L->stack).offset;
  luaF_closeupval(L,level);
  while (o = (L->tbclist).p, level <= o) {
    for (pSVar1 = o + -(ulong)(o->tbclist).delta;
        ((L->stack).p < pSVar1 && ((pSVar1->tbclist).delta == 0)); pSVar1 = pSVar1 + -0xffff) {
    }
    (L->tbclist).p = pSVar1;
    if (status == -1) {
      pSVar1 = (StkId)&L->l_G->nilvalue;
    }
    else {
      pSVar1 = o + 1;
      luaD_seterrorobj(L,status,pSVar1);
    }
    func = (L->top).p;
    pTVar2 = luaT_gettmbyobj(L,&o->val,TM_CLOSE);
    (func->val).value_ = pTVar2->value_;
    (func->val).tt_ = pTVar2->tt_;
    func[1].val.value_ = (o->val).value_;
    *(lu_byte *)((long)func + 0x18) = (o->val).tt_;
    func[2].val.value_ = (pSVar1->val).value_;
    *(lu_byte *)((long)func + 0x28) = (pSVar1->val).tt_;
    (L->top).p = func + 3;
    if (yy == 0) {
      luaD_callnoyield(L,func,0);
    }
    else {
      luaD_call(L,func,0);
    }
    level = (StkId)((long)(L->stack).p + lVar3);
  }
  return level;
}

Assistant:

StkId luaF_close (lua_State *L, StkId level, int status, int yy) {
  ptrdiff_t levelrel = savestack(L, level);
  luaF_closeupval(L, level);  /* first, close the upvalues */
  while (L->tbclist.p >= level) {  /* traverse tbc's down to that level */
    StkId tbc = L->tbclist.p;  /* get variable index */
    poptbclist(L);  /* remove it from list */
    prepcallclosemth(L, tbc, status, yy);  /* close variable */
    level = restorestack(L, levelrel);
  }
  return level;
}